

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

error_code __thiscall
llvm::sys::fs::create_directories(fs *this,Twine *Path,bool IgnoreExisting,perms Perms)

{
  bool IgnoreExisting_00;
  bool bVar1;
  perms Perms_00;
  undefined7 in_register_00000011;
  error_code eVar2;
  StringRef path;
  Twine local_170;
  Twine local_158;
  int local_140;
  undefined4 uStack_13c;
  error_category *local_138;
  error_category *local_130;
  char *local_128;
  undefined1 local_120 [8];
  StringRef Parent;
  error_code local_108;
  Twine local_f8;
  Twine *local_e0;
  error_code EC;
  StringRef P;
  SmallString<128U> PathStorage;
  perms Perms_local;
  bool IgnoreExisting_local;
  Twine *Path_local;
  error_category *local_18;
  
  IgnoreExisting_00 = (bool)((byte)Path & 1);
  Perms_00 = (perms)CONCAT71(in_register_00000011,IgnoreExisting);
  SmallString<128U>::SmallString((SmallString<128U> *)&P.Length);
  join_0x00000010_0x00000000_ = Twine::toStringRef((Twine *)this,(SmallVectorImpl<char> *)&P.Length)
  ;
  Twine::Twine(&local_f8,(StringRef *)&EC._M_cat);
  eVar2 = create_directory(&local_f8,IgnoreExisting_00,Perms_00);
  EC._0_8_ = eVar2._M_cat;
  local_e0 = (Twine *)CONCAT44(local_e0._4_4_,eVar2._M_value);
  std::error_code::error_code<llvm::errc,void>(&local_108,no_such_file_or_directory);
  bVar1 = std::operator!=((error_code *)&local_e0,&local_108);
  if (bVar1) {
    Path_local = local_e0;
    local_18 = (error_category *)EC._0_8_;
  }
  else {
    local_130 = EC._M_cat;
    local_128 = P.Data;
    path.Length = 2;
    path.Data = P.Data;
    _local_120 = sys::path::parent_path((path *)EC._M_cat,path,Perms);
    if (Parent.Data == (char *)0x0) {
      Path_local = local_e0;
      local_18 = (error_category *)EC._0_8_;
    }
    else {
      Twine::Twine(&local_158,(StringRef *)local_120);
      eVar2 = create_directories((fs *)&local_158,(Twine *)(ulong)IgnoreExisting_00,IgnoreExisting,
                                 Perms);
      local_138 = eVar2._M_cat;
      local_140 = eVar2._M_value;
      local_e0 = (Twine *)CONCAT44(uStack_13c,local_140);
      EC._0_8_ = local_138;
      bVar1 = std::error_code::operator_cast_to_bool((error_code *)&local_e0);
      if (bVar1) {
        Path_local = local_e0;
        local_18 = (error_category *)EC._0_8_;
      }
      else {
        Twine::Twine(&local_170,(StringRef *)&EC._M_cat);
        eVar2 = create_directory(&local_170,IgnoreExisting_00,Perms_00);
        local_18 = eVar2._M_cat;
        Path_local = (Twine *)(ulong)(uint)eVar2._M_value;
      }
    }
  }
  Parent.Length._4_4_ = 1;
  SmallString<128U>::~SmallString((SmallString<128U> *)&P.Length);
  eVar2._0_8_ = (ulong)Path_local & 0xffffffff;
  eVar2._M_cat = local_18;
  return eVar2;
}

Assistant:

std::error_code create_directories(const Twine &Path, bool IgnoreExisting,
                                   perms Perms) {
  SmallString<128> PathStorage;
  StringRef P = Path.toStringRef(PathStorage);

  // Be optimistic and try to create the directory
  std::error_code EC = create_directory(P, IgnoreExisting, Perms);
  // If we succeeded, or had any error other than the parent not existing, just
  // return it.
  if (EC != errc::no_such_file_or_directory)
    return EC;

  // We failed because of a no_such_file_or_directory, try to create the
  // parent.
  StringRef Parent = path::parent_path(P);
  if (Parent.empty())
    return EC;

  if ((EC = create_directories(Parent, IgnoreExisting, Perms)))
      return EC;

  return create_directory(P, IgnoreExisting, Perms);
}